

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cpp
# Opt level: O0

bool __thiscall VPPOperator::Prepare(VPPOperator *this,RunContext *ctx)

{
  undefined8 this_00;
  bool bVar1;
  vector<Connection,_std::allocator<Connection>_> *pvVar2;
  ulong uVar3;
  reference pCVar4;
  size_type sVar5;
  reference ppCVar6;
  CommandBlock *pCVar7;
  string local_340;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  undefined1 local_2d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  undefined1 local_238 [8];
  string to2;
  string local_1f8;
  undefined1 local_1d8 [8];
  string to;
  string from;
  undefined1 local_190 [4];
  uint i_2;
  string fifo;
  undefined1 local_150 [8];
  string fifoname;
  Connection *c_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<Connection,_std::allocator<Connection>_> *__range2_1;
  vector<Connection_*,_std::allocator<Connection_*>_> outputs;
  undefined1 local_e8 [4];
  int i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  string *local_88;
  string *name;
  reference local_70;
  Connection *c;
  iterator __end2;
  iterator __begin2;
  vector<Connection,_std::allocator<Connection>_> *__range2;
  Connection *con;
  undefined1 local_40 [4];
  int i;
  string command;
  RunContext *ctx_local;
  VPPOperator *this_local;
  
  command.field_2._8_8_ = ctx;
  std::__cxx11::string::string((string *)local_40,(string *)&this->command);
  for (con._4_4_ = 0; (int)con._4_4_ < this->ninputs; con._4_4_ = con._4_4_ + 1) {
    __range2 = (vector<Connection,_std::allocator<Connection>_> *)0x0;
    pvVar2 = &(this->super_BaseNode).connections;
    __end2 = std::vector<Connection,_std::allocator<Connection>_>::begin(pvVar2);
    c = (Connection *)std::vector<Connection,_std::allocator<Connection>_>::end(pvVar2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Connection_*,_std::vector<Connection,_std::allocator<Connection>_>_>
                                       *)&c), bVar1) {
      local_70 = __gnu_cxx::
                 __normal_iterator<Connection_*,_std::vector<Connection,_std::allocator<Connection>_>_>
                 ::operator*(&__end2);
      if (((VPPOperator *)local_70->input_node == this) &&
         (local_70->input_slot == PipeInputSlotNames[(int)con._4_4_])) {
        __range2 = (vector<Connection,_std::allocator<Connection>_> *)local_70;
      }
      __gnu_cxx::
      __normal_iterator<Connection_*,_std::vector<Connection,_std::allocator<Connection>_>_>::
      operator++(&__end2);
    }
    if (__range2 == (vector<Connection,_std::allocator<Connection>_> *)0x0) {
      printf("input slot %d not connected?\n",(ulong)con._4_4_);
      this_local._7_1_ = 0;
      name._0_4_ = 1;
      goto LAB_0018360a;
    }
    Connection::GetFifoName_abi_cxx11_
              (&local_a8,(Connection *)__range2,(RunContext *)command.field_2._8_8_);
    local_88 = &local_a8;
    uVar3 = std::__cxx11::string::empty();
    bVar1 = (uVar3 & 1) != 0;
    if (bVar1) {
      printf("slot %d not prepared\n",(ulong)con._4_4_);
      this_local._7_1_ = 0;
    }
    else {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_e8,
                 PipeInputSlotNames[(int)con._4_4_],0x10);
      std::
      regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>,std::char_traits<char>,std::allocator<char>>
                (&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_e8,local_88,0);
      std::__cxx11::string::operator=((string *)local_40,(string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_e8);
    }
    name._0_4_ = (uint)bVar1;
    std::__cxx11::string::~string((string *)&local_a8);
    if ((uint)name != 0) goto LAB_0018360a;
  }
  for (outputs.super__Vector_base<Connection_*,_std::allocator<Connection_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      (int)outputs.super__Vector_base<Connection_*,_std::allocator<Connection_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ < this->noutputs;
      outputs.super__Vector_base<Connection_*,_std::allocator<Connection_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           outputs.super__Vector_base<Connection_*,_std::allocator<Connection_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    std::vector<Connection_*,_std::allocator<Connection_*>_>::vector
              ((vector<Connection_*,_std::allocator<Connection_*>_> *)&__range2_1);
    pvVar2 = &(this->super_BaseNode).connections;
    __end2_1 = std::vector<Connection,_std::allocator<Connection>_>::begin(pvVar2);
    c_1 = (Connection *)std::vector<Connection,_std::allocator<Connection>_>::end(pvVar2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<Connection_*,_std::vector<Connection,_std::allocator<Connection>_>_>
                               *)&c_1), bVar1) {
      pCVar4 = __gnu_cxx::
               __normal_iterator<Connection_*,_std::vector<Connection,_std::allocator<Connection>_>_>
               ::operator*(&__end2_1);
      if (((VPPOperator *)pCVar4->output_node == this) &&
         (pCVar4->output_slot ==
          PipeOutputSlotNames
          [(int)outputs.super__Vector_base<Connection_*,_std::allocator<Connection_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_])) {
        fifoname.field_2._8_8_ = pCVar4;
        std::vector<Connection_*,_std::allocator<Connection_*>_>::push_back
                  ((vector<Connection_*,_std::allocator<Connection_*>_> *)&__range2_1,
                   (value_type *)((long)&fifoname.field_2 + 8));
      }
      __gnu_cxx::
      __normal_iterator<Connection_*,_std::vector<Connection,_std::allocator<Connection>_>_>::
      operator++(&__end2_1);
    }
    bVar1 = std::vector<Connection_*,_std::allocator<Connection_*>_>::empty
                      ((vector<Connection_*,_std::allocator<Connection_*>_> *)&__range2_1);
    if (bVar1) {
      printf("output slot %d not connected?\n",
             (ulong)outputs.super__Vector_base<Connection_*,_std::allocator<Connection_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_);
      this_local._7_1_ = 0;
      name._0_4_ = 1;
    }
    else {
      std::__cxx11::string::string((string *)local_150);
      sVar5 = std::vector<Connection_*,_std::allocator<Connection_*>_>::size
                        ((vector<Connection_*,_std::allocator<Connection_*>_> *)&__range2_1);
      if (sVar5 == 1) {
        ppCVar6 = std::vector<Connection_*,_std::allocator<Connection_*>_>::operator[]
                            ((vector<Connection_*,_std::allocator<Connection_*>_> *)&__range2_1,0);
        Connection::GetFifoName_abi_cxx11_
                  ((string *)((long)&fifo.field_2 + 8),*ppCVar6,(RunContext *)command.field_2._8_8_)
        ;
        std::__cxx11::string::operator=
                  ((string *)local_150,(string *)(fifo.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(fifo.field_2._M_local_buf + 8));
      }
      else {
        RunContext::MakeFifo_abi_cxx11_((string *)local_190,(RunContext *)command.field_2._8_8_);
        std::__cxx11::string::operator=((string *)local_150,(string *)local_190);
        for (from.field_2._12_4_ = 0;
            sVar5 = std::vector<Connection_*,_std::allocator<Connection_*>_>::size
                              ((vector<Connection_*,_std::allocator<Connection_*>_> *)&__range2_1),
            (ulong)(uint)from.field_2._12_4_ < sVar5 - 1;
            from.field_2._12_4_ = from.field_2._12_4_ + 1) {
          std::__cxx11::string::string((string *)(to.field_2._M_local_buf + 8),(string *)local_190);
          std::__cxx11::string::string((string *)local_1d8);
          sVar5 = std::vector<Connection_*,_std::allocator<Connection_*>_>::size
                            ((vector<Connection_*,_std::allocator<Connection_*>_> *)&__range2_1);
          if ((ulong)(uint)from.field_2._12_4_ == sVar5 - 2) {
            ppCVar6 = std::vector<Connection_*,_std::allocator<Connection_*>_>::operator[]
                                ((vector<Connection_*,_std::allocator<Connection_*>_> *)&__range2_1,
                                 (ulong)(from.field_2._12_4_ + 1));
            Connection::GetFifoName_abi_cxx11_
                      (&local_1f8,*ppCVar6,(RunContext *)command.field_2._8_8_);
            std::__cxx11::string::operator=((string *)local_1d8,(string *)&local_1f8);
            std::__cxx11::string::~string((string *)&local_1f8);
          }
          else {
            RunContext::MakeFifo_abi_cxx11_
                      ((string *)((long)&to2.field_2 + 8),(RunContext *)command.field_2._8_8_);
            std::__cxx11::string::operator=
                      ((string *)local_190,(string *)(to2.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)(to2.field_2._M_local_buf + 8));
            std::__cxx11::string::operator=((string *)local_1d8,(string *)local_190);
          }
          ppCVar6 = std::vector<Connection_*,_std::allocator<Connection_*>_>::operator[]
                              ((vector<Connection_*,_std::allocator<Connection_*>_> *)&__range2_1,
                               (ulong)(uint)from.field_2._12_4_);
          Connection::GetFifoName_abi_cxx11_
                    ((string *)local_238,*ppCVar6,(RunContext *)command.field_2._8_8_);
          this_00 = command.field_2._8_8_;
          pCVar7 = (CommandBlock *)operator_new(0x50);
          local_2d9 = 1;
          std::operator+(&local_2d8,"vp dup ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&to.field_2 + 8));
          std::operator+(&local_2b8,&local_2d8," ");
          std::operator+(&local_298,&local_2b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1d8);
          std::operator+(&local_278,&local_298," ");
          std::operator+(&local_258,&local_278,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_238);
          CommandBlock::CommandBlock(pCVar7,&local_258);
          local_2d9 = 0;
          RunContext::CollectBlock((RunContext *)this_00,(Block *)pCVar7);
          std::__cxx11::string::~string((string *)&local_258);
          std::__cxx11::string::~string((string *)&local_278);
          std::__cxx11::string::~string((string *)&local_298);
          std::__cxx11::string::~string((string *)&local_2b8);
          std::__cxx11::string::~string((string *)&local_2d8);
          std::__cxx11::string::~string((string *)local_238);
          std::__cxx11::string::~string((string *)local_1d8);
          std::__cxx11::string::~string((string *)(to.field_2._M_local_buf + 8));
        }
        std::__cxx11::string::~string((string *)local_190);
      }
      uVar3 = std::__cxx11::string::empty();
      bVar1 = (uVar3 & 1) != 0;
      if (bVar1) {
        printf("slot %d not prepared\n",
               (ulong)outputs.super__Vector_base<Connection_*,_std::allocator<Connection_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        this_local._7_1_ = 0;
      }
      else {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  (&local_320,
                   PipeOutputSlotNames
                   [(int)outputs.super__Vector_base<Connection_*,_std::allocator<Connection_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_],0x10);
        std::
        regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>,std::char_traits<char>,std::allocator<char>>
                  (&local_300,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   &local_320,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150,0)
        ;
        std::__cxx11::string::operator=((string *)local_40,(string *)&local_300);
        std::__cxx11::string::~string((string *)&local_300);
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_320)
        ;
      }
      name._0_4_ = (uint)bVar1;
      std::__cxx11::string::~string((string *)local_150);
    }
    std::vector<Connection_*,_std::allocator<Connection_*>_>::~vector
              ((vector<Connection_*,_std::allocator<Connection_*>_> *)&__range2_1);
    if ((uint)name != 0) goto LAB_0018360a;
  }
  pCVar7 = (CommandBlock *)operator_new(0x50);
  std::__cxx11::string::string((string *)&local_340,(string *)local_40);
  CommandBlock::CommandBlock(pCVar7,&local_340);
  this->block = pCVar7;
  std::__cxx11::string::~string((string *)&local_340);
  RunContext::CollectBlock((RunContext *)command.field_2._8_8_,&this->block->super_Block);
  this_local._7_1_ = 1;
  name._0_4_ = 1;
LAB_0018360a:
  std::__cxx11::string::~string((string *)local_40);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

virtual bool Prepare(RunContext& ctx) override
    {
        std::string command = this->command;
        for (int i = 0; i < ninputs; i++) {
            Connection* con = nullptr;
            for (auto& c : connections)
            {
                if (c.input_node != this || c.input_slot != PipeInputSlotNames[i])
                    continue;
                con = &c;
            }
            if (!con) {
                printf("input slot %d not connected?\n", i);
                return false;
            }
            const std::string& name = con->GetFifoName(ctx);
            if (name.empty()) {
                printf("slot %d not prepared\n", i);
                return false;
            }
            command = std::regex_replace(command, std::regex(PipeInputSlotNames[i]), name);
        }
        // TODO: duplicate output if multiple inputs use it
        for (int i = 0; i < noutputs; i++) {
            std::vector<Connection*> outputs;
            for (auto& c : connections)
            {
                if (c.output_node != this || c.output_slot != PipeOutputSlotNames[i])
                    continue;
                outputs.push_back(&c);
            }
            if (outputs.empty()) {
                printf("output slot %d not connected?\n", i);
                return false;
            }
            std::string fifoname;
            if (outputs.size() == 1)
            {
                fifoname = outputs[0]->GetFifoName(ctx);
            }
            else
            {
                // multiple outputs, so we need to duplicate the stream
                // XXX: this is vpp specific
                auto fifo = ctx.MakeFifo();
                fifoname = fifo;
                for (unsigned i = 0; i < outputs.size() - 1; i++)
                {
                    std::string from = fifo;
                    std::string to;
                    if (i == outputs.size() - 2)
                    {
                        to = outputs[i+1]->GetFifoName(ctx);
                    }
                    else
                    {
                        fifo = ctx.MakeFifo();
                        to = fifo;
                    }
                    std::string to2 = outputs[i]->GetFifoName(ctx);
                    ctx.CollectBlock(new CommandBlock("vp dup " + from + " " + to + " " + to2));
                }
            }
            if (fifoname.empty()) {
                printf("slot %d not prepared\n", i);
                return false;
            }
            command = std::regex_replace(command, std::regex(PipeOutputSlotNames[i]), fifoname);
        }

        block = new CommandBlock(command);
        ctx.CollectBlock(block);
        return true;
    }